

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O2

void setup_firstpass_data(AV1_COMMON *cm,FirstPassData *firstpass_data,int unit_rows,int unit_cols)

{
  int *piVar1;
  FRAME_STATS *pFVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  
  piVar1 = (int *)aom_calloc((long)(unit_cols * unit_rows),4);
  firstpass_data->raw_motion_err_list = piVar1;
  if (piVar1 == (int *)0x0) {
    aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,
                       "Failed to allocate firstpass_data->raw_motion_err_list");
  }
  pFVar2 = (FRAME_STATS *)aom_calloc((long)(unit_cols * unit_rows),0x78);
  firstpass_data->mb_stats = pFVar2;
  if (pFVar2 == (FRAME_STATS *)0x0) {
    aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate firstpass_data->mb_stats");
  }
  uVar3 = 0;
  uVar4 = 0;
  if (0 < unit_cols) {
    uVar4 = (ulong)(uint)unit_cols;
  }
  uVar5 = (ulong)(uint)unit_rows;
  if (unit_rows < 1) {
    uVar5 = uVar3;
  }
  lVar6 = 0x3c;
  for (; lVar7 = lVar6, uVar8 = uVar4, uVar3 != uVar5; uVar3 = uVar3 + 1) {
    while (bVar9 = uVar8 != 0, uVar8 = uVar8 - 1, bVar9) {
      *(undefined4 *)((long)&firstpass_data->mb_stats->intra_error + lVar7) = 0xffffffff;
      lVar7 = lVar7 + 0x78;
    }
    lVar6 = lVar6 + (long)unit_cols * 0x78;
  }
  return;
}

Assistant:

static void setup_firstpass_data(AV1_COMMON *const cm,
                                 FirstPassData *firstpass_data,
                                 const int unit_rows, const int unit_cols) {
  CHECK_MEM_ERROR(cm, firstpass_data->raw_motion_err_list,
                  aom_calloc(unit_rows * unit_cols,
                             sizeof(*firstpass_data->raw_motion_err_list)));
  CHECK_MEM_ERROR(
      cm, firstpass_data->mb_stats,
      aom_calloc(unit_rows * unit_cols, sizeof(*firstpass_data->mb_stats)));
  for (int j = 0; j < unit_rows; j++) {
    for (int i = 0; i < unit_cols; i++) {
      firstpass_data->mb_stats[j * unit_cols + i].image_data_start_row =
          INVALID_ROW;
    }
  }
}